

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Mie.cpp
# Opt level: O2

void __thiscall
OpenMD::Mie::addExplicitInteraction
          (Mie *this,AtomType *atype1,AtomType *atype2,RealType sigma,RealType epsilon,int nRep,
          int mAtt)

{
  pointer piVar1;
  pointer pvVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  int iVar6;
  int iVar7;
  long lVar8;
  int iVar9;
  size_type __new_size;
  int iVar10;
  double dVar11;
  double dVar12;
  pair<std::_Rb_tree_iterator<int>,_bool> pVar13;
  int atid2;
  int atid1;
  int local_4c;
  RealType local_48;
  double local_40;
  int local_34;
  
  dVar12 = (double)nRep;
  dVar11 = (double)mAtt;
  local_40 = dVar12 - dVar11;
  local_48 = epsilon;
  dVar11 = pow(dVar12 / dVar11,dVar11 / local_40);
  iVar9 = (int)(this->MieTypes)._M_t._M_impl.super__Rb_tree_header._M_node_count;
  local_34 = AtomType::getIdent(atype1);
  local_4c = AtomType::getIdent(atype2);
  pVar13 = std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
           _M_insert_unique<int_const&>
                     ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
                      &this->MieTypes,&local_34);
  piVar1 = (this->MieTids).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pVar13.second == false) {
    iVar10 = piVar1[local_34];
    iVar6 = iVar9;
  }
  else {
    piVar1[local_34] = iVar9;
    iVar6 = iVar9 + 1;
    iVar10 = iVar9;
  }
  dVar11 = (dVar11 * dVar12) / local_40;
  pVar13 = std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
           _M_insert_unique<int_const&>
                     ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
                      &this->MieTypes,&local_4c);
  piVar1 = (this->MieTids).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pVar13.second == false) {
    iVar9 = piVar1[local_4c];
    iVar7 = iVar6;
  }
  else {
    piVar1[local_4c] = iVar6;
    iVar7 = iVar6 + 1;
    iVar9 = iVar6;
  }
  __new_size = (size_type)iVar7;
  std::
  vector<std::vector<OpenMD::MieInteractionData,_std::allocator<OpenMD::MieInteractionData>_>,_std::allocator<std::vector<OpenMD::MieInteractionData,_std::allocator<OpenMD::MieInteractionData>_>_>_>
  ::resize(&this->MixingMap,__new_size);
  lVar8 = (long)iVar10;
  std::vector<OpenMD::MieInteractionData,_std::allocator<OpenMD::MieInteractionData>_>::resize
            ((this->MixingMap).
             super__Vector_base<std::vector<OpenMD::MieInteractionData,_std::allocator<OpenMD::MieInteractionData>_>,_std::allocator<std::vector<OpenMD::MieInteractionData,_std::allocator<OpenMD::MieInteractionData>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start + lVar8,__new_size);
  pvVar2 = (this->MixingMap).
           super__Vector_base<std::vector<OpenMD::MieInteractionData,_std::allocator<OpenMD::MieInteractionData>_>,_std::allocator<std::vector<OpenMD::MieInteractionData,_std::allocator<OpenMD::MieInteractionData>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  lVar4 = (long)iVar9;
  lVar3 = *(long *)&pvVar2[lVar8].
                    super__Vector_base<OpenMD::MieInteractionData,_std::allocator<OpenMD::MieInteractionData>_>
                    ._M_impl.super__Vector_impl_data;
  lVar5 = lVar4 * 0x28;
  *(RealType *)(lVar3 + lVar5) = sigma;
  *(RealType *)(lVar3 + 8 + lVar5) = local_48;
  *(double *)(lVar3 + 0x10 + lVar5) = 1.0 / sigma;
  *(int *)(lVar3 + 0x18 + lVar5) = nRep;
  *(int *)(lVar3 + 0x1c + lVar5) = mAtt;
  *(double *)(lVar3 + 0x20 + lVar5) = dVar11;
  if (iVar9 != iVar10) {
    std::vector<OpenMD::MieInteractionData,_std::allocator<OpenMD::MieInteractionData>_>::resize
              (pvVar2 + lVar4,__new_size);
    lVar3 = *(long *)&(this->MixingMap).
                      super__Vector_base<std::vector<OpenMD::MieInteractionData,_std::allocator<OpenMD::MieInteractionData>_>,_std::allocator<std::vector<OpenMD::MieInteractionData,_std::allocator<OpenMD::MieInteractionData>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[lVar4].
                      super__Vector_base<OpenMD::MieInteractionData,_std::allocator<OpenMD::MieInteractionData>_>
                      ._M_impl.super__Vector_impl_data;
    lVar8 = lVar8 * 0x28;
    *(RealType *)(lVar3 + lVar8) = sigma;
    *(RealType *)(lVar3 + 8 + lVar8) = local_48;
    *(double *)(lVar3 + 0x10 + lVar8) = 1.0 / sigma;
    *(int *)(lVar3 + 0x18 + lVar8) = nRep;
    *(int *)(lVar3 + 0x1c + lVar8) = mAtt;
    *(double *)(lVar3 + 0x20 + lVar8) = dVar11;
  }
  return;
}

Assistant:

void Mie::addExplicitInteraction(AtomType* atype1, AtomType* atype2,
                                   RealType sigma, RealType epsilon, int nRep,
                                   int mAtt) {
    MieInteractionData mixer;
    mixer.sigma   = sigma;
    mixer.epsilon = epsilon;
    mixer.sigmai  = 1.0 / mixer.sigma;
    mixer.nRep    = nRep;
    mixer.mAtt    = mAtt;

    RealType n = RealType(nRep);
    RealType m = RealType(mAtt);

    mixer.nmScale = n * pow(n / m, m / (n - m)) / (n - m);

    int nMie  = MieTypes.size();
    int atid1 = atype1->getIdent();
    int atid2 = atype2->getIdent();
    int mietid1, mietid2;

    pair<set<int>::iterator, bool> ret;
    ret = MieTypes.insert(atid1);
    if (ret.second == false) {
      // already had this type in the MieMap, just get the mietid:
      mietid1 = MieTids[atid1];
    } else {
      // didn't already have it, so make a new one and assign it:
      mietid1        = nMie;
      MieTids[atid1] = nMie;
      nMie++;
    }

    ret = MieTypes.insert(atid2);
    if (ret.second == false) {
      // already had this type in the MieMap, just get the mietid:
      mietid2 = MieTids[atid2];
    } else {
      // didn't already have it, so make a new one and assign it:
      mietid2        = nMie;
      MieTids[atid2] = nMie;
      nMie++;
    }

    MixingMap.resize(nMie);
    MixingMap[mietid1].resize(nMie);

    MixingMap[mietid1][mietid2] = mixer;
    if (mietid2 != mietid1) {
      MixingMap[mietid2].resize(nMie);
      MixingMap[mietid2][mietid1] = mixer;
    }
  }